

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

int X509V3_get_value_int(CONF_VALUE *value,ASN1_INTEGER **aint)

{
  ASN1_INTEGER *pAVar1;
  ASN1_INTEGER *itmp;
  ASN1_INTEGER **aint_local;
  CONF_VALUE *value_local;
  
  pAVar1 = s2i_ASN1_INTEGER((X509V3_EXT_METHOD *)0x0,value->value);
  if (pAVar1 != (ASN1_INTEGER *)0x0) {
    ASN1_INTEGER_free(*aint);
    *aint = pAVar1;
  }
  else {
    ERR_add_error_data(6,"section:",value->section,",name:",value->name,",value:",value->value);
  }
  value_local._4_4_ = (uint)(pAVar1 != (ASN1_INTEGER *)0x0);
  return value_local._4_4_;
}

Assistant:

int X509V3_get_value_int(const CONF_VALUE *value, ASN1_INTEGER **aint) {
  ASN1_INTEGER *itmp;
  if (!(itmp = s2i_ASN1_INTEGER(NULL, value->value))) {
    X509V3_conf_err(value);
    return 0;
  }
  ASN1_INTEGER_free(*aint);
  *aint = itmp;
  return 1;
}